

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

uint get_terminal_columns(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  curl_off_t num;
  char *p;
  
  pcVar3 = (char *)curl_getenv();
  if (pcVar3 != (char *)0x0) {
    p = pcVar3;
    iVar1 = Curl_str_number(&p,&num,10000);
    iVar2 = CONCAT22(num._2_2_,(undefined2)num);
    uVar5 = CONCAT44(num._4_4_,iVar2);
    curl_free();
    if (((iVar1 == 0) && (0x14 < (long)uVar5)) && (iVar2 != 0)) goto LAB_0010aa60;
  }
  iVar2 = ioctl(0,0x5413,&num);
  uVar4 = (uint)num._2_2_;
  if (iVar2 != 0) {
    uVar4 = 0;
  }
  uVar5 = (ulong)uVar4;
  if (9999 < uVar4) {
    uVar5 = 0;
  }
LAB_0010aa60:
  uVar4 = 0x4f;
  if ((uint)uVar5 != 0) {
    uVar4 = (uint)uVar5;
  }
  return uVar4;
}

Assistant:

unsigned int get_terminal_columns(void)
{
  unsigned int width = 0;
  char *colp = curl_getenv("COLUMNS");
  if(colp) {
    curl_off_t num;
    const char *p = colp;
    if(!curlx_str_number(&p, &num, 10000) && (num > 20))
      width = (unsigned int)num;
    curl_free(colp);
  }

  if(!width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = (int)ts.ws_col;
#elif defined(_WIN32) && !defined(CURL_WINDOWS_UWP) && !defined(UNDER_CE)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    if(cols >= 0 && cols < 10000)
      width = (unsigned int)cols;
  }
  if(!width)
    width = 79;
  return width; /* 79 for unknown, might also be tiny or enormous */
}